

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall
mocker::ir::Branch::Branch
          (Branch *this,shared_ptr<mocker::ir::Addr> *condition,shared_ptr<mocker::ir::Label> *then,
          shared_ptr<mocker::ir::Label> *else_)

{
  shared_ptr<mocker::ir::Label> *else__local;
  shared_ptr<mocker::ir::Label> *then_local;
  shared_ptr<mocker::ir::Addr> *condition_local;
  Branch *this_local;
  
  IRInst::IRInst(&this->super_IRInst,Branch);
  Terminator::Terminator(&this->super_Terminator);
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Branch_00188270;
  (this->super_Terminator)._vptr_Terminator = (_func_int **)&PTR__Branch_00188290;
  std::shared_ptr<mocker::ir::Addr>::shared_ptr(&this->condition,condition);
  std::shared_ptr<mocker::ir::Label>::shared_ptr(&this->then,then);
  std::shared_ptr<mocker::ir::Label>::shared_ptr(&this->else_,else_);
  return;
}

Assistant:

Branch(std::shared_ptr<Addr> condition, std::shared_ptr<Label> then,
         std::shared_ptr<Label> else_)
      : IRInst(InstType::Branch), condition(std::move(condition)),
        then(std::move(then)), else_(std::move(else_)) {}